

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O1

void __thiscall duckdb::UpdateInfo::Print(UpdateInfo *this)

{
  string local_28;
  
  ToString_abi_cxx11_(&local_28,this);
  Printer::Print(&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p);
  }
  return;
}

Assistant:

void UpdateInfo::Print() {
	Printer::Print(ToString());
}